

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::AlignFirstTextHeightToWidgets(void)

{
  float text_offset_y;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImVec2 local_8;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (pIVar1->SkipItems != false) {
    return;
  }
  text_offset_y = (pIVar2->Style).FramePadding.y;
  local_8 = (ImVec2)((ulong)(uint)(text_offset_y + text_offset_y + pIVar2->FontSize) << 0x20);
  ItemSize(&local_8,text_offset_y);
  SameLine(0.0,0.0);
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }